

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_smart_cover::state_read(cse_smart_cover *this)

{
  uint16_t in_DX;
  xr_packet *in_RSI;
  
  state_read((cse_smart_cover *)&this[-1].m_cs_unk1_sz.field_2,in_RSI,in_DX);
  return;
}

Assistant:

void cse_smart_cover::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object::state_read(packet, size);
	cse_shape::cform_read(packet);
	packet.r_sz(m_cs_unk1_sz);
	packet.r_float(m_cs_unk2_float);
	if (m_version >= CSE_VERSION_0x78) {
		packet.r_float(m_enter_min_enemy_distance);
		packet.r_float(m_exit_min_enemy_distance);
	}
	if (m_version >= CSE_VERSION_0x7a)
		packet.r_bool(m_is_combat_cover);
	if (m_version >= CSE_VERSION_0x80)
		packet.r_u8(m_cs_unk3_u8);
}